

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O0

void __thiscall
Liby::PollerSelect::updateChanel(PollerSelect *this,Channel *ch,bool readable,bool writable)

{
  int iVar1;
  bool bVar2;
  int fd;
  bool writable_local;
  bool readable_local;
  Channel *ch_local;
  PollerSelect *this_local;
  
  bVar2 = false;
  if (ch != (Channel *)0x0) {
    iVar1 = Channel::get_fd(ch);
    bVar2 = -1 < iVar1;
  }
  if (!bVar2) {
    __assert_fail("ch && ch->get_fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp"
                  ,0x1e,"virtual void Liby::PollerSelect::updateChanel(Channel *, bool, bool)");
  }
  iVar1 = Channel::get_fd(ch);
  if (readable) {
    (this->rset_).fds_bits[iVar1 / 0x40] =
         1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | (this->rset_).fds_bits[iVar1 / 0x40];
  }
  else {
    (this->rset_).fds_bits[iVar1 / 0x40] =
         (1L << ((byte)((long)iVar1 % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
         (this->rset_).fds_bits[iVar1 / 0x40];
  }
  if (writable) {
    (this->wset_).fds_bits[iVar1 / 0x40] =
         1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | (this->wset_).fds_bits[iVar1 / 0x40];
  }
  else {
    (this->wset_).fds_bits[iVar1 / 0x40] =
         (1L << ((byte)((long)iVar1 % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
         (this->wset_).fds_bits[iVar1 / 0x40];
  }
  return;
}

Assistant:

void PollerSelect::updateChanel(Channel *ch, bool readable, bool writable) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();

    if (readable) {
        FD_SET(fd, &rset_);
    } else {
        FD_CLR(fd, &rset_);
    }

    if (writable) {
        FD_SET(fd, &wset_);
    } else {
        FD_CLR(fd, &wset_);
    }
}